

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_check_byte_utf8(uchar state,uchar c)

{
  uint local_c;
  uchar s;
  uchar c_local;
  uchar state_local;
  
  if (state == '\0') {
    if (c < 0x80) {
      local_c = 0;
    }
    else if ((c < 0xc2) || (0xf4 < c)) {
      local_c = 0xffffffff;
    }
    else if (c < 0xe0) {
      local_c = 0x8c;
    }
    else {
      local_c = (uint)e0f4[(int)(c - 0xe0)];
    }
  }
  else if ((c < (state & 0xf0)) || ((state & 0xf0) + 0x10 + (state & 0xc) * 4 <= (uint)c)) {
    local_c = 0xffffffff;
  }
  else {
    local_c = (uint)e0f4[(int)((state & 3) + 0x15)];
  }
  return local_c;
}

Assistant:

int
lws_check_byte_utf8(unsigned char state, unsigned char c)
{
	unsigned char s = state;

	if (!s) {
		if (c >= 0x80) {
			if (c < 0xc2 || c > 0xf4)
				return -1;
			if (c < 0xe0)
				return 0x80 | ((4 - 1) << 2);
			else
				return e0f4[c - 0xe0];
		}

		return s;
	}
	if (c < (s & 0xf0) || c >= (s & 0xf0) + 0x10 + ((s << 2) & 0x30))
		return -1;

	return e0f4[21 + (s & 3)];
}